

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

avector<AffineSpace3ff> * __thiscall
embree::XMLLoader::loadAffineSpace3faArray
          (avector<AffineSpace3ff> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vector *pVVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  XML *this_00;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar14;
  int iVar15;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar16;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar17;
  runtime_error *this_01;
  long *plVar18;
  ulong uVar19;
  ulong uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  XMLLoader *this_02;
  long lVar25;
  size_t sVar26;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar27;
  Ref<embree::XML> child;
  vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
  temp;
  undefined1 local_e8 [32];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Base_ptr local_98;
  size_t sStack_90;
  _Base_ptr local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  pointer local_68;
  pointer pRStack_60;
  pointer local_58;
  pointer pTStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_40;
  
  if (xml->ptr == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
  }
  else {
    iVar15 = std::__cxx11::string::compare((char *)&xml->ptr->name);
    if (iVar15 == 0) {
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      this_02 = (XMLLoader *)xml->ptr;
      if ((_Base_ptr)(this_02->id2node)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          (this_02->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
        pAVar16 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        uVar19 = 0;
        uVar20 = 0;
      }
      else {
        local_80 = (_Base_ptr)&__return_storage_ptr__->size_active;
        uVar19 = 0;
        pAVar16 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        uVar24 = 0;
        do {
          XML::child((XML *)local_e8,(size_t)this_02);
          load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                    ((AffineSpace3fa *)(local_e8 + 0x20),this_02,(Ref<embree::XML> *)local_e8);
          local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_c8._0_8_;
          paStack_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_c8._8_8_;
          local_58 = (pointer)local_b8._M_allocated_capacity;
          pTStack_50 = (pointer)local_b8._8_8_;
          local_68 = (pointer)local_a8._M_allocated_capacity;
          pRStack_60 = (pointer)local_a8._8_8_;
          local_78 = local_98;
          uStack_70 = sStack_90;
          uVar20 = uVar24 + 1;
          if (uVar19 <= uVar24) {
            uVar23 = uVar20;
            uVar22 = uVar19;
            if (uVar19 != 0) {
              do {
                uVar23 = uVar22 * 2 + (ulong)(uVar22 * 2 == 0);
                uVar22 = uVar23;
              } while (uVar23 <= uVar24);
            }
            if (uVar19 != uVar23) {
              pAVar17 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        alignedMalloc(uVar23 << 6,0x10);
              if (uVar24 != 0) {
                lVar25 = 0x30;
                uVar19 = uVar24;
                do {
                  puVar1 = (undefined8 *)((long)pAVar16 + lVar25 + -0x30);
                  uVar7 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pAVar17 + lVar25 + -0x30);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar7;
                  puVar1 = (undefined8 *)((long)pAVar16 + lVar25 + -0x20);
                  uVar7 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pAVar17 + lVar25 + -0x20);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar7;
                  puVar1 = (undefined8 *)((long)pAVar16 + lVar25 + -0x10);
                  uVar7 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pAVar17 + lVar25 + -0x10);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar7;
                  puVar1 = (undefined8 *)((long)&(pAVar16->l).vx.field_0 + lVar25);
                  uVar7 = puVar1[1];
                  puVar2 = (undefined8 *)((long)&(pAVar17->l).vx.field_0 + lVar25);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar7;
                  lVar25 = lVar25 + 0x40;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
              }
              alignedFree(pAVar16);
              uVar19 = uVar23;
              pAVar16 = pAVar17;
            }
          }
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&pAVar16[uVar24].l.vx.field_0 = local_48;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)((long)&pAVar16[uVar24].l.vx.field_0 + 8) = paStack_40;
          pVVar3 = &pAVar16[uVar24].l.vy;
          *(pointer *)&pVVar3->field_0 = local_58;
          *(pointer *)((long)&pVVar3->field_0 + 8) = pTStack_50;
          pVVar3 = &pAVar16[uVar24].l.vz;
          *(pointer *)&pVVar3->field_0 = local_68;
          *(pointer *)((long)&pVVar3->field_0 + 8) = pRStack_60;
          pVVar3 = &pAVar16[uVar24].p;
          (pVVar3->field_0).m128[0] = (float)local_78;
          (pVVar3->field_0).m128[1] = local_78._4_4_;
          (pVVar3->field_0).m128[2] = (float)uStack_70;
          (pVVar3->field_0).m128[3] = uStack_70._4_4_;
          if ((long *)local_e8._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_e8._0_8_ + 0x18))();
          }
          this_02 = (XMLLoader *)xml->ptr;
          uVar24 = uVar20;
        } while (uVar20 < (ulong)((long)((this_02->id2node)._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count -
                                        (long)(this_02->id2node)._M_t._M_impl.super__Rb_tree_header.
                                              _M_header._M_right) >> 3));
      }
      __return_storage_ptr__->size_active = uVar20;
      __return_storage_ptr__->size_alloced = uVar19;
      __return_storage_ptr__->items = pAVar16;
    }
    else {
      this_00 = xml->ptr;
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"ofs","");
      XML::parm((string *)(local_e8 + 0x20),this_00,(string *)local_e8);
      iVar15 = std::__cxx11::string::compare(local_e8 + 0x20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_);
      }
      if (iVar15 == 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_((string *)local_e8,&xml->ptr->loc);
        plVar18 = (long *)std::__cxx11::string::append(local_e8);
        local_c8._0_8_ = *plVar18;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._0_8_ == paVar21) {
          local_b8._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_b8._8_8_ = plVar18[3];
          local_c8._0_8_ = &local_b8;
        }
        else {
          local_b8._M_allocated_capacity = paVar21->_M_allocated_capacity;
        }
        local_c8._8_8_ = plVar18[1];
        *plVar18 = (long)paVar21;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)(local_e8 + 0x20));
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      loadBinary<std::vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>,std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>>>>
                ((vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                  *)(local_e8 + 0x20),this,xml);
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      lVar25 = (long)(local_c8._8_8_ - local_c8._0_8_) >> 4;
      sVar26 = lVar25 * -0x5555555555555555;
      if (local_c8._8_8_ == local_c8._0_8_) {
        __return_storage_ptr__->size_active = sVar26;
        pAVar16 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      }
      else {
        pAVar16 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                  alignedMalloc(lVar25 * -0x5555555555555540,0x10);
        __return_storage_ptr__->items = pAVar16;
        alignedFree((void *)0x0);
        __return_storage_ptr__->size_active = sVar26;
        __return_storage_ptr__->size_alloced = sVar26;
      }
      if (local_c8._8_8_ != local_c8._0_8_) {
        paVar27 = &(pAVar16->p).field_0;
        lVar25 = 0x28;
        uVar20 = 0;
        do {
          uVar7 = *(undefined8 *)(local_c8._0_8_ + lVar25 + -0x24);
          uVar8 = *(undefined8 *)(local_c8._0_8_ + lVar25 + -0x18);
          uVar4 = *(undefined4 *)(local_c8._0_8_ + lVar25 + -0x1c);
          uVar9 = *(undefined8 *)(local_c8._0_8_ + lVar25 + -0xc);
          uVar5 = *(undefined4 *)
                   (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_c8._0_8_ + -0x10))->_M_local_buf + lVar25);
          uVar10 = *(undefined8 *)(local_c8._0_8_ + lVar25);
          uVar6 = *(undefined4 *)(local_c8._0_8_ + lVar25 + -4);
          aVar11.m128[1] = (float)(int)uVar7;
          aVar11.m128[0] = (float)*(undefined4 *)(local_c8._0_8_ + lVar25 + -0x28);
          aVar11.m128[2] = (float)(int)((ulong)uVar7 >> 0x20);
          aVar11.m128[3] = 0.0;
          paVar27[-3] = aVar11;
          aVar12.m128[1] = (float)(int)uVar8;
          aVar12.m128[0] = (float)uVar4;
          aVar12.m128[2] = (float)(int)((ulong)uVar8 >> 0x20);
          aVar12.m128[3] = 0.0;
          paVar27[-2] = aVar12;
          aVar13.m128[1] = (float)(int)uVar9;
          aVar13.m128[0] = (float)uVar5;
          aVar13.m128[2] = (float)(int)((ulong)uVar9 >> 0x20);
          aVar13.m128[3] = 0.0;
          paVar27[-1] = aVar13;
          aVar14.m128[1] = (float)(int)uVar10;
          aVar14.m128[0] = (float)uVar6;
          aVar14.m128[2] = (float)(int)((ulong)uVar10 >> 0x20);
          aVar14.m128[3] = 0.0;
          *paVar27 = aVar14;
          uVar20 = uVar20 + 1;
          paVar27 = paVar27 + 4;
          lVar25 = lVar25 + 0x30;
        } while (uVar20 < (ulong)(((long)(local_c8._8_8_ - local_c8._0_8_) >> 4) *
                                 -0x5555555555555555));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

avector<AffineSpace3ff> XMLLoader::loadAffineSpace3faArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<AffineSpace3ff>();

    if (xml->name == "AffineSpaceArray") {
      avector<AffineSpace3ff> spaceArray;
      for (size_t i = 0; i < xml->size(); ++i) {
        auto child = xml->child(i);
        AffineSpace3ff space = AffineSpace3ff(load<AffineSpace3fa>(child));
        spaceArray.push_back(space);
      }
      return spaceArray;
    }
    else if (xml->parm("ofs") != "") {
      std::vector<AffineSpace3f> temp = loadBinary<std::vector<AffineSpace3f>>(xml);
      avector<AffineSpace3ff> data; data.resize(temp.size());
      for (size_t i=0; i<temp.size(); i++) data[i] = AffineSpace3ff(AffineSpace3fa(temp[i]));
      return data;
    }
    else
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid AffineSpace3fa array");
  }